

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# purearray.cpp
# Opt level: O0

void __thiscall PureArray::setValue(PureArray *this,int v)

{
  int iVar1;
  uint local_1c;
  uint local_18;
  int j;
  int i;
  int v_local;
  PureArray *this_local;
  
  local_18 = 0;
  while( true ) {
    iVar1 = Array::getHeight(&this->super_Array);
    if (iVar1 <= (int)local_18) break;
    local_1c = 0;
    while( true ) {
      iVar1 = Array::getWidth(&this->super_Array);
      if (iVar1 <= (int)local_1c) break;
      (*(this->super_Array)._vptr_Array[3])(this,(ulong)(uint)v,(ulong)local_1c,(ulong)local_18);
      local_1c = local_1c + 1;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void PureArray::setValue(int v)
{
	for (int i = 0; i < getHeight(); ++i) {
		for (int j = 0; j < getWidth(); ++j) {
			setData(v, j, i);
		}
	}
}